

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManLutParams(Gia_Man_t *p,int *pnCurLuts,int *pnCurEdges,int *pnCurLevels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  int *piVar4;
  Gia_Obj_t *pObj;
  long lVar5;
  long lVar6;
  
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime);
    if (iVar1 != 0) {
      *pnCurLuts = 0;
      *pnCurEdges = 0;
      for (iVar1 = 1; iVar1 < p->nObjs; iVar1 = iVar1 + 1) {
        iVar2 = Gia_ObjIsLut(p,iVar1);
        if (iVar2 != 0) {
          *pnCurLuts = *pnCurLuts + 1;
          iVar2 = Gia_ObjLutSize(p,iVar1);
          *pnCurEdges = *pnCurEdges + iVar2;
        }
      }
      iVar1 = Gia_ManLutLevelWithBoxes(p);
      *pnCurLevels = iVar1;
      return;
    }
  }
  __ptr = calloc((long)p->nObjs,4);
  *pnCurLuts = 0;
  *pnCurEdges = 0;
  for (lVar5 = 1; iVar1 = (int)lVar5, lVar5 < p->nObjs; lVar5 = lVar5 + 1) {
    iVar2 = Gia_ObjIsLut(p,iVar1);
    if (iVar2 != 0) {
      *pnCurLuts = *pnCurLuts + 1;
      iVar2 = Gia_ObjLutSize(p,iVar1);
      *pnCurEdges = *pnCurEdges + iVar2;
      lVar6 = 0;
      iVar2 = 0;
      while( true ) {
        iVar3 = Gia_ObjLutSize(p,iVar1);
        if (iVar3 <= lVar6) break;
        piVar4 = Gia_ObjLutFanins(p,iVar1);
        iVar3 = *(int *)((long)__ptr + (long)piVar4[lVar6] * 4);
        if (iVar2 <= iVar3) {
          iVar2 = iVar3;
        }
        lVar6 = lVar6 + 1;
      }
      *(int *)((long)__ptr + lVar5 * 4) = iVar2 + 1;
    }
  }
  *pnCurLevels = 0;
  for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
    pObj = Gia_ManCo(p,iVar1);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar2 = *pnCurLevels;
    iVar3 = Gia_ObjFaninId0p(p,pObj);
    if (iVar2 < *(int *)((long)__ptr + (long)iVar3 * 4)) {
      iVar2 = Gia_ObjFaninId0p(p,pObj);
      *pnCurLevels = *(int *)((long)__ptr + (long)iVar2 * 4);
    }
  }
  free(__ptr);
  return;
}

Assistant:

void Gia_ManLutParams( Gia_Man_t * p, int * pnCurLuts, int * pnCurEdges, int * pnCurLevels )
{
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t *)p->pManTime) )
    {
        int i;
        *pnCurLuts = 0;
        *pnCurEdges = 0;
        Gia_ManForEachLut( p, i )
        {
            (*pnCurLuts)++;
            (*pnCurEdges) += Gia_ObjLutSize(p, i);
        }
        *pnCurLevels = Gia_ManLutLevelWithBoxes( p );
    }
    else
    {
        Gia_Obj_t * pObj;
        int i, k, iFan;
        int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
        *pnCurLuts = 0;
        *pnCurEdges = 0;
        Gia_ManForEachLut( p, i )
        {
            int Level = 0;
            (*pnCurLuts)++;
            (*pnCurEdges) += Gia_ObjLutSize(p, i);
            Gia_LutForEachFanin( p, i, iFan, k )
                if ( Level < pLevels[iFan] )
                    Level = pLevels[iFan];
            pLevels[i] = Level + 1;
        }
        *pnCurLevels = 0;
        Gia_ManForEachCo( p, pObj, k )
            if ( *pnCurLevels < pLevels[Gia_ObjFaninId0p(p, pObj)] )
                *pnCurLevels = pLevels[Gia_ObjFaninId0p(p, pObj)];
        ABC_FREE( pLevels );
    }
}